

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O0

KDataStream * __thiscall
KDIS::DATA_TYPE::OrientationError::Encode
          (KDataStream *__return_storage_ptr__,OrientationError *this)

{
  OrientationError *this_local;
  KDataStream *stream;
  
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream OrientationError::Encode() const
{
    KDataStream stream;

    OrientationError::Encode( stream );

    return stream;
}